

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

void socks_proxy_cf_close(Curl_cfilter *cf,Curl_easy *data)

{
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  cf->field_0x24 = cf->field_0x24 & 0xfe;
  socks_proxy_cf_free(cf);
  (*(code *)cf->next->cft->do_close)(cf->next,data);
  return;
}

Assistant:

static void socks_proxy_cf_close(struct Curl_cfilter *cf,
                                 struct Curl_easy *data)
{

  DEBUGASSERT(cf->next);
  cf->connected = FALSE;
  socks_proxy_cf_free(cf);
  cf->next->cft->do_close(cf->next, data);
}